

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_luv.c
# Opt level: O3

int LogLuvDecode32(TIFF *tif,uint8_t *op,tmsize_t occ,uint16_t s)

{
  byte bVar1;
  uint8_t *puVar2;
  long lVar3;
  int iVar4;
  undefined6 in_register_0000000a;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  uint8_t *p;
  byte *pbVar11;
  bool bVar12;
  
  if ((int)CONCAT62(in_register_0000000a,s) != 0) {
    __assert_fail("s == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/galkahana[P]PDF-Writer/LibTiff/tif_luv.c"
                  ,0x146,"int LogLuvDecode32(TIFF *, uint8_t *, tmsize_t, uint16_t)");
  }
  puVar2 = tif->tif_data;
  if (puVar2 == (uint8_t *)0x0) {
    __assert_fail("sp != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/galkahana[P]PDF-Writer/LibTiff/tif_luv.c"
                  ,0x148,"int LogLuvDecode32(TIFF *, uint8_t *, tmsize_t, uint16_t)");
  }
  lVar3 = occ / (long)*(int *)(puVar2 + 0xc);
  p = op;
  if (*(int *)(puVar2 + 4) != 2) {
    if (*(long *)(puVar2 + 0x18) < lVar3) {
      TIFFErrorExtR(tif,"LogLuvDecode32","Translation buffer too short");
      return 0;
    }
    p = *(uint8_t **)(puVar2 + 0x10);
  }
  _TIFFmemset(p,0,lVar3 * 4);
  pbVar11 = tif->tif_rawcp;
  uVar7 = tif->tif_rawcc;
  iVar4 = 0x18;
  while ((lVar3 < 1 || ((long)uVar7 < 1))) {
    lVar9 = 0;
LAB_002a71fa:
    if (lVar3 != lVar9) {
      TIFFErrorExtR(tif,"LogLuvDecode32","Not enough data at row %u (short %ld pixels)",
                    (ulong)tif->tif_row);
      tif->tif_rawcp = pbVar11;
      tif->tif_rawcc = uVar7;
      return 0;
    }
    bVar12 = iVar4 == 0;
    iVar4 = iVar4 + -8;
    if (bVar12) {
      (**(code **)(puVar2 + 0x20))(puVar2,op,lVar3);
      tif->tif_rawcp = pbVar11;
      tif->tif_rawcc = uVar7;
      return 1;
    }
  }
  lVar9 = 0;
  do {
    uVar5 = (uint)*pbVar11;
    if ((char)*pbVar11 < '\0') {
      if (uVar7 < 2) goto LAB_002a71fa;
      bVar1 = pbVar11[1];
      pbVar11 = pbVar11 + 2;
      uVar7 = uVar7 - 2;
      if ((uVar5 != 0x7e) && (lVar9 < lVar3)) {
        iVar6 = uVar5 - 0x7f;
        do {
          *(uint *)(p + lVar9 * 4) = *(uint *)(p + lVar9 * 4) | (uint)bVar1 << ((byte)iVar4 & 0x1f);
          lVar9 = lVar9 + 1;
          bVar12 = iVar6 == 0;
          iVar6 = iVar6 + -1;
          if (bVar12) break;
        } while (lVar9 < lVar3);
      }
    }
    else {
      if (uVar7 == 1) {
        pbVar11 = pbVar11 + 1;
LAB_002a71f8:
        uVar7 = 0;
        goto LAB_002a71fa;
      }
      uVar10 = 1;
      while ((lVar8 = lVar9 + uVar10 + -1, (int)uVar10 - uVar5 != 1 && (lVar8 < lVar3))) {
        *(uint *)(p + uVar10 * 4 + lVar9 * 4 + -4) =
             *(uint *)(p + uVar10 * 4 + lVar9 * 4 + -4) |
             (uint)pbVar11[uVar10] << ((byte)iVar4 & 0x1f);
        uVar10 = uVar10 + 1;
        if (uVar7 == uVar10) {
          pbVar11 = pbVar11 + uVar10;
          lVar9 = lVar9 + uVar10 + -1;
          goto LAB_002a71f8;
        }
      }
      uVar7 = uVar7 - uVar10;
      pbVar11 = pbVar11 + uVar10;
      lVar9 = lVar8;
    }
    if ((lVar3 <= lVar9) || ((long)uVar7 < 1)) goto LAB_002a71fa;
  } while( true );
}

Assistant:

static int LogLuvDecode32(TIFF *tif, uint8_t *op, tmsize_t occ, uint16_t s)
{
    static const char module[] = "LogLuvDecode32";
    LogLuvState *sp;
    int shft;
    tmsize_t i;
    tmsize_t npixels;
    unsigned char *bp;
    uint32_t *tp;
    uint32_t b;
    tmsize_t cc;
    int rc;

    (void)s;
    assert(s == 0);
    sp = DecoderState(tif);
    assert(sp != NULL);

    npixels = occ / sp->pixel_size;

    if (sp->user_datafmt == SGILOGDATAFMT_RAW)
        tp = (uint32_t *)op;
    else
    {
        if (sp->tbuflen < npixels)
        {
            TIFFErrorExtR(tif, module, "Translation buffer too short");
            return (0);
        }
        tp = (uint32_t *)sp->tbuf;
    }
    _TIFFmemset((void *)tp, 0, npixels * sizeof(tp[0]));

    bp = (unsigned char *)tif->tif_rawcp;
    cc = tif->tif_rawcc;
    /* get each byte string */
    for (shft = 24; shft >= 0; shft -= 8)
    {
        for (i = 0; i < npixels && cc > 0;)
        {
            if (*bp >= 128)
            { /* run */
                if (cc < 2)
                    break;
                rc = *bp++ + (2 - 128);
                b = (uint32_t)*bp++ << shft;
                cc -= 2;
                while (rc-- && i < npixels)
                    tp[i++] |= b;
            }
            else
            {               /* non-run */
                rc = *bp++; /* nul is noop */
                while (--cc && rc-- && i < npixels)
                    tp[i++] |= (uint32_t)*bp++ << shft;
            }
        }
        if (i != npixels)
        {
            TIFFErrorExtR(tif, module,
                          "Not enough data at row %" PRIu32
                          " (short %" TIFF_SSIZE_FORMAT " pixels)",
                          tif->tif_row, npixels - i);
            tif->tif_rawcp = (uint8_t *)bp;
            tif->tif_rawcc = cc;
            return (0);
        }
    }
    (*sp->tfunc)(sp, op, npixels);
    tif->tif_rawcp = (uint8_t *)bp;
    tif->tif_rawcc = cc;
    return (1);
}